

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_proxy_isExtensible(JSContext *ctx,JSValue obj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  JSProxyData *argv;
  JSValue JVar4;
  JSValue method;
  JSValueUnion local_30;
  int64_t local_28;
  
  argv = get_proxy_method(ctx,(JSValue *)&local_30,obj,0x61);
  iVar1 = -1;
  if (argv != (JSProxyData *)0x0) {
    if ((int)local_28 == 3) {
      iVar1 = JS_IsExtensible(ctx,argv->target);
      return iVar1;
    }
    JVar4.tag = local_28;
    JVar4.u.float64 = local_30.float64;
    JVar4 = JS_CallFree(ctx,JVar4,argv->handler,1,&argv->target);
    if ((int)JVar4.tag != 6) {
      iVar2 = JS_ToBoolFree(ctx,JVar4);
      iVar3 = JS_IsExtensible(ctx,argv->target);
      if ((-1 < iVar3) && (iVar1 = iVar2, iVar2 != iVar3)) {
        JS_ThrowTypeError(ctx,"proxy: inconsistent isExtensible");
        iVar1 = -1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int js_proxy_isExtensible(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret;
    BOOL res;
    int res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_isExtensible);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_IsExtensible(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return -1;
    res = JS_ToBoolFree(ctx, ret);
    res2 = JS_IsExtensible(ctx, s->target);
    if (res2 < 0)
        return res2;
    if (res != res2) {
        JS_ThrowTypeError(ctx, "proxy: inconsistent isExtensible");
        return -1;
    }
    return res;
}